

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_portals.cxx
# Opt level: O2

void __thiscall level_tools::reconstruct_portals(level_tools *this)

{
  xr_level_portals *pxVar1;
  pointer pppVar2;
  portal_data *ppVar3;
  xr_scene_portals *pxVar4;
  xr_custom_object_vec *this_00;
  xr_scene_sectors *pxVar5;
  xr_portal_object *this_01;
  pointer pppVar6;
  xr_name_gen name;
  xr_portal_object *local_38;
  
  if (this->m_level->m_portals != (xr_level_portals *)0x0) {
    xray_re::msg("building %s","portal.part");
    pxVar1 = this->m_level->m_portals;
    pxVar4 = xray_re::xr_scene::portals(this->m_scene);
    this_00 = &(pxVar4->super_xr_scene_objects).m_objects;
    std::vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>::reserve
              (this_00,(long)(pxVar1->m_portals).
                             super__Vector_base<xray_re::portal_data_*,_std::allocator<xray_re::portal_data_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pxVar1->m_portals).
                             super__Vector_base<xray_re::portal_data_*,_std::allocator<xray_re::portal_data_*>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3);
    pxVar5 = xray_re::xr_scene::sectors(this->m_scene);
    if ((pxVar5->super_xr_scene_objects).m_objects.
        super__Vector_base<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (pxVar5->super_xr_scene_objects).m_objects.
        super__Vector_base<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      __assert_fail("!sectors.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_tools_portals.cxx"
                    ,0x16,"void level_tools::reconstruct_portals()");
    }
    xray_re::xr_name_gen::init(&name,(EVP_PKEY_CTX *)"portal");
    pppVar2 = (pxVar1->m_portals).
              super__Vector_base<xray_re::portal_data_*,_std::allocator<xray_re::portal_data_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (pppVar6 = (pxVar1->m_portals).
                   super__Vector_base<xray_re::portal_data_*,_std::allocator<xray_re::portal_data_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; pppVar6 != pppVar2;
        pppVar6 = pppVar6 + 1) {
      ppVar3 = *pppVar6;
      this_01 = (xr_portal_object *)operator_new(200);
      xray_re::xr_portal_object::xr_portal_object(this_01,this->m_scene);
      std::__cxx11::string::assign((char *)&(this_01->super_xr_custom_object).m_name);
      std::__cxx11::string::_M_assign((string *)&this_01->m_sector_front);
      std::__cxx11::string::_M_assign((string *)&this_01->m_sector_back);
      std::vector<xray_re::_vector3<float>,std::allocator<xray_re::_vector3<float>>>::
      _M_assign_aux<xray_re::_vector3<float>const*>
                ((vector<xray_re::_vector3<float>,std::allocator<xray_re::_vector3<float>>> *)
                 &this_01->m_vertices,&ppVar3->vertices,
                 (ppVar3->vertices).array + (ppVar3->vertices).count);
      local_38 = this_01;
      std::vector<xray_re::xr_custom_object*,std::allocator<xray_re::xr_custom_object*>>::
      emplace_back<xray_re::xr_custom_object*>
                ((vector<xray_re::xr_custom_object*,std::allocator<xray_re::xr_custom_object*>> *)
                 this_00,(xr_custom_object **)&local_38);
      xray_re::xr_name_gen::next(&name);
    }
    xray_re::xr_level::clear_portals(this->m_level);
    xray_re::xr_name_gen::~xr_name_gen(&name);
  }
  return;
}

Assistant:

void level_tools::reconstruct_portals()
{
	if (m_level->portals() == 0)
		return;
	msg("building %s", "portal.part");

	const portal_data_vec& portals = m_level->portals()->portals();
	xr_custom_object_vec& cobjects = m_scene->portals()->objects();
	cobjects.reserve(portals.size());

	xr_custom_object_vec& sectors = m_scene->sectors()->objects();
	xr_assert(!sectors.empty());

	xr_name_gen name("portal");
	for (portal_data_vec_cit it = portals.begin(), end = portals.end(); it != end; ++it, name.next()) {
		const portal_data* portal = *it;
		xr_portal_object* new_portal = new xr_portal_object(*m_scene);
		new_portal->co_name() = name.get();
		new_portal->sector_front() = sectors[portal->sector_front]->co_name();
		new_portal->sector_back() = sectors[portal->sector_back]->co_name();
		new_portal->vertices().assign(portal->vertices.begin(), portal->vertices.end());
		cobjects.push_back(new_portal);
	}
	m_level->clear_portals();
}